

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

char * google::protobuf::internal::UnknownFieldParse
                 (uint32 tag,InternalMetadataWithArena *metadata,char *ptr,ParseContext *ctx)

{
  void *pvVar1;
  char *pcVar2;
  UnknownFieldSet *unknown;
  
  pvVar1 = (metadata->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    unknown = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&metadata->
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
  }
  else {
    unknown = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  pcVar2 = UnknownFieldParse((ulong)tag,unknown,ptr,ctx);
  return pcVar2;
}

Assistant:

const char* UnknownFieldParse(uint32 tag, InternalMetadataWithArena* metadata,
                              const char* ptr, ParseContext* ctx) {
  return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
}